

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_terminal.cpp
# Opt level: O0

void __thiscall ImportInt64_ErrorOnMaxPlus1_Test::TestBody(ImportInt64_ErrorOnMaxPlus1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  error_code *lhs;
  char *in_R9;
  error_code eVar3;
  AssertHelper local_178;
  Message local_170;
  error_code local_168;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  string local_f0;
  undefined8 local_d0;
  uint64_t expected;
  undefined1 local_c0 [8];
  parser<pstore::exchange::import_ns::callbacks> parser;
  int64_t v;
  ImportInt64_ErrorOnMaxPlus1_Test *this_local;
  
  parser.coordinate_.column = 0;
  parser.coordinate_.row = 0;
  pstore::gsl::not_null<long_*>::not_null((not_null<long_*> *)&expected,(long *)&parser.coordinate_)
  ;
  anon_unknown.dwarf_394386::ImportInt64::make_json_int64_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_c0,&this->super_ImportInt64,
             (not_null<long_*>)expected);
  local_d0 = 0x8000000000000000;
  std::__cxx11::to_string(&local_f0,0x8000000000000000);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
            ((parser<pstore::exchange::import_ns::callbacks> *)local_c0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof
            ((parser<pstore::exchange::import_ns::callbacks> *)local_c0);
  local_111 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_110,(AssertionResult *)0x2ecd1e,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_terminal.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  lhs = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                  ((parser<pstore::exchange::import_ns::callbacks> *)local_c0);
  eVar3 = pstore::exchange::import_ns::make_error_code(number_too_large);
  local_168._M_cat = eVar3._M_cat;
  local_168._M_value = eVar3._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_158,"parser.last_error ()",
             "make_error_code (error::number_too_large)",lhs,&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_terminal.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_c0);
  return;
}

Assistant:

TEST_F (ImportInt64, ErrorOnMaxPlus1) {
    auto v = std::int64_t{0};
    auto parser = make_json_int64_parser (&v);
    auto const expected =
        static_cast<std::uint64_t> (std::numeric_limits<std::int64_t>::max ()) + 1U;
    parser.input (std::to_string (expected));
    parser.eof ();

    // Check the result.
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (), make_error_code (error::number_too_large));
}